

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend.hpp
# Opt level: O2

int __thiscall BCL::init(BCL *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int extraout_EAX;
  string *this_00;
  allocator<char> local_3d;
  int nprocs;
  int rank;
  
  comm = &ompi_mpi_comm_world;
  shared_segment_size = (long)this << 0x14;
  bVar1 = mpi_initialized();
  if (!bVar1) {
    if ((char)ctx == '\0') {
      MPI_Init(0,0);
    }
    else {
      MPI_Init_thread(0,0,3,&nprocs);
      if (nprocs < 3) {
        this_00 = (string *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rank,
                   "BCL Asked for MPI_THREAD_MULTIPLE, but was denied. You need a thread-safe MPI implementation."
                   ,&local_3d);
        std::__cxx11::string::string(this_00,(string *)&rank);
        __cxa_throw(this_00,&error::typeinfo,error::~error);
      }
    }
    we_initialized = 1;
  }
  MPI_Comm_rank(comm,&rank);
  MPI_Comm_size(comm,&nprocs);
  my_rank = (long)rank;
  my_nprocs = (long)nprocs;
  MPI_Info_create(&info);
  MPI_Info_set(info,"accumulate_ordering","none");
  MPI_Info_set(info,"accumulate_ops","same_op_no_op");
  MPI_Info_set(info,"same_size","true");
  MPI_Info_set(info,"same_disp_unit","true");
  MPI_Win_allocate(shared_segment_size,1,info,comm,&smem_base_ptr,&win);
  bcl_finalized = 0;
  smem_heap = smem_base_ptr + 0x40;
  flist = 0;
  MPI_Barrier(comm);
  MPI_Win_lock_all(0,win);
  barrier();
  return extraout_EAX;
}

Assistant:

void init(uint64_t shared_segment_size = 256, bool thread_safe = false) {
  BCL::comm = MPI_COMM_WORLD;
  BCL::shared_segment_size = 1024*1024*shared_segment_size;

  if (!mpi_initialized()) {
    if (!thread_safe) {
      MPI_Init(NULL, NULL);
    } else {
      int provided;
      MPI_Init_thread(NULL, NULL, MPI_THREAD_MULTIPLE, &provided);
      if (provided < MPI_THREAD_MULTIPLE) {
        throw BCL::error("BCL Asked for MPI_THREAD_MULTIPLE, but was denied. "
                         "You need a thread-safe MPI implementation.");
      }
    }
    we_initialized = true;
  }

  int rank, nprocs;
  MPI_Comm_rank(BCL::comm, &rank);
  MPI_Comm_size(BCL::comm, &nprocs);
  BCL::my_rank = rank;
  BCL::my_nprocs = nprocs;

  MPI_Info_create(&info);
  MPI_Info_set(info, "accumulate_ordering", "none");
  MPI_Info_set(info, "accumulate_ops", "same_op_no_op");
  MPI_Info_set(info, "same_size", "true");
  MPI_Info_set(info, "same_disp_unit", "true");

  MPI_Win_allocate(BCL::shared_segment_size, 1, info, BCL::comm,
    &smem_base_ptr, &win);

  bcl_finalized = false;

  init_malloc();

  MPI_Barrier(BCL::comm);
  MPI_Win_lock_all(0, win);
  BCL::barrier();
}